

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O2

void boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_any_ofF<char> *IsSpace)

{
  is_any_ofF<char> iStack_48;
  is_any_ofF<char> local_30;
  
  detail::is_any_ofF<char>::is_any_ofF(&local_30,IsSpace);
  trim_right_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>(Input,&local_30);
  detail::is_any_ofF<char>::~is_any_ofF(&local_30);
  detail::is_any_ofF<char>::is_any_ofF(&iStack_48,IsSpace);
  trim_left_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>(Input,&iStack_48);
  detail::is_any_ofF<char>::~is_any_ofF(&iStack_48);
  return;
}

Assistant:

inline void trim_if(SequenceT& Input, PredicateT IsSpace)
        {
            ::boost::algorithm::trim_right_if( Input, IsSpace );
            ::boost::algorithm::trim_left_if( Input, IsSpace );
        }